

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzread.c
# Opt level: O0

int gzgetc(gzFile file)

{
  byte *pbVar1;
  int iVar2;
  uint local_2c;
  gz_statep state;
  uchar buf [1];
  gzFile pvStack_18;
  int ret;
  gzFile file_local;
  
  if (file == (gzFile)0x0) {
    file_local._4_4_ = 0xffffffff;
  }
  else if ((*file == 0x1c4f) && (*(int *)((long)file + 0x6c) == 0)) {
    if (*(int *)((long)file + 0x38) == 0) {
      pvStack_18 = file;
      iVar2 = gzread(file,(voidp)((long)&state + 3),1);
      if (iVar2 < 1) {
        local_2c = 0xffffffff;
      }
      else {
        local_2c = (uint)state._3_1_;
      }
      file_local._4_4_ = local_2c;
    }
    else {
      *(int *)((long)file + 0x38) = *(int *)((long)file + 0x38) + -1;
      *(long *)((long)file + 0x10) = *(long *)((long)file + 0x10) + 1;
      pbVar1 = *(byte **)((long)file + 0x30);
      *(byte **)((long)file + 0x30) = pbVar1 + 1;
      file_local._4_4_ = (uint)*pbVar1;
    }
  }
  else {
    file_local._4_4_ = 0xffffffff;
  }
  return file_local._4_4_;
}

Assistant:

int ZEXPORT gzgetc(gzFile file)
{
    int ret;
    unsigned char buf[1];
    gz_statep state;

    /* get internal structure */
    if (file == NULL)
        return -1;
    state = (gz_statep)file;

    /* check that we're reading and that there's no error */
    if (state->mode != GZ_READ || state->err != Z_OK)
        return -1;

    /* try output buffer (no need to check for skip request) */
    if (state->have) {
        state->have--;
        state->pos++;
        return *(state->next)++;
    }

    /* nothing there -- try gzread() */
    ret = gzread(file, buf, 1);
    return ret < 1 ? -1 : buf[0];
}